

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O2

string * duckdb::GenerateDateFormat
                   (string *__return_storage_ptr__,string *separator,char *format_template)

{
  difference_type val;
  long lVar1;
  string format_specifier;
  allocator local_49;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  long local_40;
  
  ::std::__cxx11::string::string((string *)&local_48,format_template,&local_49);
  local_49 = (allocator)0x2d;
  val = ::std::
        __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                  (local_48,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_48._M_current + local_40),
                   (_Iter_equals_val<const_char>)&local_49);
  NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (lVar1 = 0; local_40 != lVar1; lVar1 = lVar1 + 1) {
    if (local_48._M_current[lVar1] == '-') {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string GenerateDateFormat(const string &separator, const char *format_template) {
	string format_specifier = format_template;
	const auto amount_of_dashes = NumericCast<idx_t>(std::count(format_specifier.begin(), format_specifier.end(), '-'));
	// All our date formats must have at least one -
	D_ASSERT(amount_of_dashes);
	string result;
	result.reserve(format_specifier.size() - amount_of_dashes + (amount_of_dashes * separator.size()));
	for (const auto &character : format_specifier) {
		if (character == '-') {
			result += separator;
		} else {
			result += character;
		}
	}
	return result;
}